

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboColorMultiTex2DCase::render(FboColorMultiTex2DCase *this,Surface *dst)

{
  ContextWrapper *pCVar1;
  deUint32 dVar2;
  bool bVar3;
  DataType DVar4;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  int iVar5;
  int iVar6;
  DataTypes *pDVar7;
  Context *pCVar8;
  TextureFormat *pTVar9;
  deUint32 *pdVar10;
  deUint32 *textures;
  bool bVar11;
  deUint32 tmpTex;
  ContextWrapper *local_638;
  TransferFormat local_630;
  TextureFormat texFmt1;
  TextureFormat texFmt0;
  deUint32 tex1;
  deUint32 tex0;
  deUint32 fbo1;
  deUint32 fbo0;
  TextureLevel data;
  Vector<float,_4> local_5d8;
  PixelBufferAccess local_5c8;
  Surface *local_5a0;
  Vector<float,_4> local_598;
  TextureFormatInfo fmtInfo1;
  TextureFormatInfo fmtInfo0;
  Texture2DShader multiTexShader;
  Texture2DShader texToFbo1Shader;
  Texture2DShader texToFbo0Shader;
  
  local_5a0 = dst;
  texFmt0 = glu::mapGLInternalFormat(*(deUint32 *)&(this->super_FboColorbufferCase).field_0x8c);
  texFmt1 = glu::mapGLInternalFormat(this->m_tex1Fmt);
  tcu::getTextureFormatInfo(&fmtInfo0,&texFmt0);
  tcu::getTextureFormatInfo(&fmtInfo1,&texFmt1);
  texToFbo1Shader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texToFbo1Shader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar7 = FboTestUtil::DataTypes::operator<<((DataTypes *)&texToFbo1Shader,TYPE_SAMPLER_2D);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt0);
  tcu::operator-((tcu *)&multiTexShader,&fmtInfo0.valueMax,&fmtInfo0.valueMin);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFbo0Shader,pDVar7,DVar4,(Vec4 *)&multiTexShader,&fmtInfo0.valueMin);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&texToFbo1Shader);
  multiTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  multiTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar7 = FboTestUtil::DataTypes::operator<<((DataTypes *)&multiTexShader,TYPE_SAMPLER_2D);
  DVar4 = FboTestUtil::getFragmentOutputType(&texFmt1);
  tcu::operator-((tcu *)&data,&fmtInfo1.valueMax,&fmtInfo1.valueMin);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFbo1Shader,pDVar7,DVar4,(Vec4 *)&data,&fmtInfo1.valueMin);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&multiTexShader);
  data.m_format.order = R;
  data.m_format.type = SNORM_INT8;
  data.m_size.m_data[0] = 0;
  data.m_size.m_data[1] = 0;
  data.m_size.m_data[2] = 0;
  data._20_4_ = 0;
  DVar4 = glu::getSampler2DType(texFmt0);
  pDVar7 = FboTestUtil::DataTypes::operator<<((DataTypes *)&data,DVar4);
  DVar4 = glu::getSampler2DType(texFmt1);
  pDVar7 = FboTestUtil::DataTypes::operator<<(pDVar7,DVar4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_5c8,1.0);
  tcu::Vector<float,_4>::Vector(&local_5d8,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&multiTexShader,pDVar7,TYPE_FLOAT_VEC4,(Vec4 *)&local_5c8,&local_5d8);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&data);
  pCVar1 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  program = (*pCVar8->_vptr_Context[0x75])(pCVar8,&texToFbo0Shader);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  program_00 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&texToFbo1Shader);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  program_01 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&multiTexShader);
  tcu::operator*((tcu *)&data,0.5,&fmtInfo0.lookupScale);
  tcu::operator*((tcu *)&local_5c8,0.5,&fmtInfo0.lookupBias);
  FboTestUtil::Texture2DShader::setTexScaleBias(&multiTexShader,0,(Vec4 *)&data,(Vec4 *)&local_5c8);
  tcu::operator*((tcu *)&data,0.5,&fmtInfo1.lookupScale);
  tcu::operator*((tcu *)&local_5c8,0.5,&fmtInfo1.lookupBias);
  FboTestUtil::Texture2DShader::setTexScaleBias(&multiTexShader,1,(Vec4 *)&data,(Vec4 *)&local_5c8);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  FboTestUtil::Texture2DShader::setUniforms(&texToFbo0Shader,pCVar8,program);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  FboTestUtil::Texture2DShader::setUniforms(&texToFbo1Shader,pCVar8,program_00);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  FboTestUtil::Texture2DShader::setUniforms(&multiTexShader,pCVar8,program_01);
  local_638 = pCVar1;
  iVar5 = 2;
  while (iVar5 != 0) {
    pTVar9 = &texFmt1;
    if (iVar5 == 2) {
      pTVar9 = &texFmt0;
    }
    local_630 = glu::getTransferFormat(*pTVar9);
    dVar2 = *(deUint32 *)((long)(&this->m_tex0Size + -1) + (ulong)(iVar5 != 2) * 4);
    bVar3 = glu::isGLInternalColorFormatFilterable(dVar2);
    bVar11 = iVar5 != 2;
    pdVar10 = &fbo1;
    if (!bVar11) {
      pdVar10 = &fbo0;
    }
    textures = &tex1;
    if (!bVar11) {
      textures = &tex0;
    }
    sglr::ContextWrapper::glGenFramebuffers(pCVar1,1,pdVar10);
    sglr::ContextWrapper::glGenTextures(pCVar1,1,textures);
    sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,*textures);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2801,bVar3 | 0x2600);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2800,bVar3 | 0x2600);
    sglr::ContextWrapper::glTexImage2D
              (pCVar1,0xde1,0,dVar2,(&this->m_tex0Size)[bVar11].m_data[0],
               (&this->m_tex0Size)[bVar11].m_data[1],0,local_630.format,local_630.dataType,
               (void *)0x0);
    sglr::ContextWrapper::glBindFramebuffer(pCVar1,0x8d40,*pdVar10);
    sglr::ContextWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0xde1,*textures,0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    iVar5 = iVar5 + -1;
  }
  iVar5 = 2;
  while( true ) {
    pCVar1 = local_638;
    if (iVar5 == 0) break;
    tmpTex = 0;
    local_630.format._0_1_ = iVar5 != 2;
    pdVar10 = &fbo1;
    if (iVar5 == 2) {
      pdVar10 = &fbo0;
    }
    dVar2 = *pdVar10;
    local_5c8.super_ConstPixelBufferAccess.m_format = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel(&data,(TextureFormat *)&local_5c8,0x80,0x80,1);
    if (iVar5 == 2) {
      tcu::TextureLevel::getAccess(&local_5c8,&data);
      tcu::Vector<float,_4>::Vector(&local_5d8,0.0);
      tcu::Vector<float,_4>::Vector(&local_598,1.0);
      tcu::fillWithComponentGradients(&local_5c8,&local_5d8,&local_598);
    }
    else {
      tcu::TextureLevel::getAccess(&local_5c8,&data);
      local_5d8.m_data[0] = 0.2;
      local_5d8.m_data[1] = 0.7;
      local_5d8.m_data[2] = 0.1;
      local_5d8.m_data[3] = 1.0;
      local_598.m_data[0] = 0.7;
      local_598.m_data[1] = 0.1;
      local_598.m_data[2] = 0.5;
      local_598.m_data[3] = 0.8;
      tcu::fillWithGrid(&local_5c8,8,&local_5d8,&local_598);
    }
    pCVar1 = local_638;
    sglr::ContextWrapper::glGenTextures(local_638,1,&tmpTex);
    sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,tmpTex);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2601);
    sglr::ContextWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2601);
    tcu::TextureLevel::getAccess(&local_5c8,&data);
    sglr::ContextWrapper::glTexImage2D
              (pCVar1,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,
               local_5c8.super_ConstPixelBufferAccess.m_data);
    sglr::ContextWrapper::glBindFramebuffer(pCVar1,0x8d40,dVar2);
    sglr::ContextWrapper::glViewport
              (pCVar1,0,0,(&this->m_tex0Size)[(ulong)local_630 & 0xff].m_data[0],
               (&this->m_tex0Size)[(ulong)local_630 & 0xff].m_data[1]);
    pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
    dVar2 = program_00;
    if (iVar5 == 2) {
      dVar2 = program;
    }
    local_5c8.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_5c8.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_5c8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    local_5d8.m_data[0] = 1.0;
    local_5d8.m_data[1] = 1.0;
    local_5d8.m_data._8_8_ = local_5d8.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar8,dVar2,(Vec3 *)&local_5c8,(Vec3 *)&local_5d8);
    tcu::TextureLevel::~TextureLevel(&data);
    iVar5 = iVar5 + -1;
  }
  sglr::ContextWrapper::glBindFramebuffer(local_638,0x8d40,0);
  iVar5 = sglr::ContextWrapper::getWidth(pCVar1);
  iVar6 = sglr::ContextWrapper::getHeight(pCVar1);
  sglr::ContextWrapper::glViewport(pCVar1,0,0,iVar5,iVar6);
  sglr::ContextWrapper::glActiveTexture(pCVar1,0x84c0);
  sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,tex0);
  sglr::ContextWrapper::glActiveTexture(pCVar1,0x84c1);
  sglr::ContextWrapper::glBindTexture(pCVar1,0xde1,tex1);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(pCVar1);
  data.m_format.order = 0xbf800000;
  data.m_format.type = 0xbf800000;
  data.m_size.m_data._0_8_ = data.m_size.m_data._0_8_ & 0xffffffff00000000;
  local_5c8.super_ConstPixelBufferAccess.m_format.order = 0x3f800000;
  local_5c8.super_ConstPixelBufferAccess.m_format.type = 0x3f800000;
  local_5c8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  sglr::drawQuad(pCVar8,program_01,(Vec3 *)&data,(Vec3 *)&local_5c8);
  iVar5 = sglr::ContextWrapper::getWidth(pCVar1);
  iVar6 = sglr::ContextWrapper::getHeight(pCVar1);
  FboTestCase::readPixels((FboTestCase *)this,local_5a0,0,0,iVar5,iVar6);
  FboTestUtil::Texture2DShader::~Texture2DShader(&multiTexShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFbo1Shader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFbo0Shader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		texFmt0			= glu::mapGLInternalFormat(m_tex0Fmt);
		tcu::TextureFormat		texFmt1			= glu::mapGLInternalFormat(m_tex1Fmt);
		tcu::TextureFormatInfo	fmtInfo0		= tcu::getTextureFormatInfo(texFmt0);
		tcu::TextureFormatInfo	fmtInfo1		= tcu::getTextureFormatInfo(texFmt1);

		Texture2DShader			texToFbo0Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt0), fmtInfo0.valueMax-fmtInfo0.valueMin, fmtInfo0.valueMin);
		Texture2DShader			texToFbo1Shader	(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt1), fmtInfo1.valueMax-fmtInfo1.valueMin, fmtInfo1.valueMin);
		Texture2DShader			multiTexShader	(DataTypes() << glu::getSampler2DType(texFmt0) << glu::getSampler2DType(texFmt1), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFbo0ShaderID = getCurrentContext()->createProgram(&texToFbo0Shader);
		deUint32				texToFbo1ShaderID = getCurrentContext()->createProgram(&texToFbo1Shader);
		deUint32				multiTexShaderID  = getCurrentContext()->createProgram(&multiTexShader);

		// Setup shaders
		multiTexShader.setTexScaleBias(0, fmtInfo0.lookupScale * 0.5f, fmtInfo0.lookupBias * 0.5f);
		multiTexShader.setTexScaleBias(1, fmtInfo1.lookupScale * 0.5f, fmtInfo1.lookupBias * 0.5f);
		texToFbo0Shader.setUniforms(*getCurrentContext(), texToFbo0ShaderID);
		texToFbo1Shader.setUniforms(*getCurrentContext(), texToFbo1ShaderID);
		multiTexShader.setUniforms (*getCurrentContext(), multiTexShaderID);

		// Framebuffers.
		deUint32				fbo0, fbo1;
		deUint32				tex0, tex1;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(ndx ? texFmt1 : texFmt0);
			deUint32				format			= ndx ? m_tex1Fmt : m_tex0Fmt;
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(format);
			const IVec2&			size			= ndx ? m_tex1Size : m_tex0Size;
			deUint32&				fbo				= ndx ? fbo1 : fbo0;
			deUint32&				tex				= ndx ? tex1 : tex0;

			glGenFramebuffers(1, &fbo);
			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_2D, tex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, format, size.x(), size.y(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// Render textures to both framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			deUint32			fbo			= ndx ? fbo1 : fbo0;
			const IVec2&		viewport	= ndx ? m_tex1Size : m_tex0Size;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			if (ndx == 0)
				tcu::fillWithComponentGradients(data.getAccess(), Vec4(0.0f), Vec4(1.0f));
			else
				tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), ndx ? texToFbo1ShaderID : texToFbo0ShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Render to framebuffer.
		glBindFramebuffer(GL_FRAMEBUFFER, 0);
		glViewport(0, 0, getWidth(), getHeight());
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, tex0);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, tex1);
		sglr::drawQuad(*getCurrentContext(), multiTexShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}